

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

bool google::protobuf::safe_uint_internal<unsigned_long>(string *text,unsigned_long *value_p)

{
  char *pcVar1;
  pointer pcVar2;
  bool bVar3;
  char *pcVar4;
  byte unaff_BPL;
  char *pcVar5;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  *value_p = 0;
  pcVar4 = (text->_M_dataplus)._M_p;
  pcVar1 = pcVar4 + text->_M_string_length;
  if (0 < (long)text->_M_string_length) {
    do {
      if (*pcVar4 != ' ') break;
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 < pcVar1);
  }
  do {
    pcVar5 = pcVar1;
    bVar3 = true;
    if (pcVar5 <= pcVar4) goto LAB_001deb10;
    pcVar1 = pcVar5 + -1;
  } while (pcVar5[-1] == ' ');
  unaff_BPL = *pcVar4 == '-';
  if (((!(bool)unaff_BPL) && (*pcVar4 != '+')) || (pcVar4 + 1 < pcVar5)) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)text);
    std::__cxx11::string::operator=((string *)text,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    bVar3 = false;
  }
LAB_001deb10:
  if ((unaff_BPL & 1) == 0 && !bVar3) {
    pcVar2 = (text->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,pcVar2 + text->_M_string_length);
    bVar3 = safe_parse_positive_int<unsigned_long>(&local_60,value_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool safe_uint_internal(std::string text, IntType *value_p) {
  *value_p = 0;
  bool negative;
  if (!safe_parse_sign(&text, &negative) || negative) {
    return false;
  }
  return safe_parse_positive_int(text, value_p);
}